

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void pugi::impl::anon_unknown_0::text_output_indent
               (xml_buffered_writer *writer,char_t *indent,size_t indent_length,uint depth)

{
  char_t cVar1;
  char_t cVar2;
  ulong uVar3;
  
  switch(indent_length) {
  case 1:
    if (depth != 0) {
      do {
        cVar1 = *indent;
        uVar3 = writer->bufsize;
        if (0x7ff < uVar3) {
          xml_buffered_writer::flush(writer,writer->buffer,uVar3);
          writer->bufsize = 0;
          uVar3 = 0;
        }
        writer->buffer[uVar3] = cVar1;
        writer->bufsize = uVar3 + 1;
        depth = depth - 1;
      } while (depth != 0);
    }
    break;
  case 2:
    if (depth != 0) {
      do {
        cVar1 = *indent;
        cVar2 = indent[1];
        uVar3 = writer->bufsize;
        if (0x7fe < uVar3) {
          xml_buffered_writer::flush(writer,writer->buffer,uVar3);
          writer->bufsize = 0;
          uVar3 = 0;
        }
        writer->buffer[uVar3] = cVar1;
        writer->buffer[uVar3 + 1] = cVar2;
        writer->bufsize = uVar3 + 2;
        depth = depth - 1;
      } while (depth != 0);
    }
    break;
  case 3:
    if (depth != 0) {
      do {
        xml_buffered_writer::write
                  (writer,(int)*indent,(void *)(ulong)(uint)(int)indent[1],
                   (ulong)(uint)(int)indent[2]);
        depth = depth - 1;
      } while (depth != 0);
    }
    break;
  case 4:
    if (depth != 0) {
      do {
        xml_buffered_writer::write
                  (writer,(int)*indent,(void *)(ulong)(uint)(int)indent[1],
                   (ulong)(uint)(int)indent[2]);
        depth = depth - 1;
      } while (depth != 0);
    }
    break;
  default:
    if (depth != 0) {
      do {
        uVar3 = writer->bufsize + indent_length;
        if (uVar3 < 0x801) {
          memcpy(writer->buffer + writer->bufsize,indent,indent_length);
          writer->bufsize = uVar3;
        }
        else {
          xml_buffered_writer::write_direct(writer,indent,indent_length);
        }
        depth = depth - 1;
      } while (depth != 0);
    }
  }
  return;
}

Assistant:

PUGI__FN void text_output_indent(xml_buffered_writer& writer, const char_t* indent, size_t indent_length, unsigned int depth)
	{
		switch (indent_length)
		{
		case 1:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0]);
			break;
		}

		case 2:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0], indent[1]);
			break;
		}

		case 3:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0], indent[1], indent[2]);
			break;
		}

		case 4:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write(indent[0], indent[1], indent[2], indent[3]);
			break;
		}

		default:
		{
			for (unsigned int i = 0; i < depth; ++i)
				writer.write_buffer(indent, indent_length);
		}
		}
	}